

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_font_cid.c
# Opt level: O0

HPDF_Font HPDF_Type0Font_New(HPDF_MMgr mmgr,HPDF_FontDef_conflict fontdef,HPDF_Encoder encoder,
                            HPDF_Xref xref)

{
  void *pvVar1;
  HPDF_INT HVar2;
  undefined4 *s;
  HPDF_STATUS HVar3;
  HPDF_STATUS HVar4;
  HPDF_STATUS HVar5;
  long lVar6;
  HPDF_Dict p_Var7;
  HPDF_Array array;
  HPDF_Font p_Var8;
  HPDF_Array descendant_fonts;
  HPDF_STATUS ret;
  HPDF_CMapEncoderAttr encoder_attr;
  HPDF_FontAttr attr;
  HPDF_Dict font;
  HPDF_Xref xref_local;
  HPDF_Encoder encoder_local;
  HPDF_FontDef_conflict fontdef_local;
  HPDF_MMgr mmgr_local;
  
  mmgr_local = (HPDF_MMgr)HPDF_Dict_New(mmgr);
  if ((HPDF_Dict)mmgr_local == (HPDF_Dict)0x0) {
    mmgr_local = (HPDF_MMgr)0x0;
  }
  else {
    (((HPDF_Dict)mmgr_local)->header).obj_class =
         (((HPDF_Dict)mmgr_local)->header).obj_class | 0x100;
    if (encoder->type == HPDF_ENCODER_TYPE_DOUBLE_BYTE) {
      if ((fontdef->type == HPDF_FONTDEF_TYPE_CID) || (fontdef->type == HPDF_FONTDEF_TYPE_TRUETYPE))
      {
        s = (undefined4 *)HPDF_GetMem(mmgr,0x58);
        if (s == (undefined4 *)0x0) {
          HPDF_Dict_Free((HPDF_Dict)mmgr_local);
          mmgr_local = (HPDF_MMgr)0x0;
        }
        else {
          (((HPDF_Dict)mmgr_local)->header).obj_class =
               (((HPDF_Dict)mmgr_local)->header).obj_class | 0x100;
          ((HPDF_Dict)mmgr_local)->write_fn = (HPDF_Dict_OnWriteFunc)0x0;
          ((HPDF_Dict)mmgr_local)->free_fn = OnFree_Func;
          ((HPDF_Dict)mmgr_local)->attr = s;
          pvVar1 = encoder->attr;
          HPDF_MemSet(s,'\0',0x58);
          s[1] = *(undefined4 *)((long)pvVar1 + 0x40118);
          *(code **)(s + 2) = TextWidth;
          *(code **)(s + 4) = MeasureText;
          *(HPDF_FontDef_conflict *)(s + 6) = fontdef;
          *(HPDF_Encoder *)(s + 8) = encoder;
          *(HPDF_Xref *)(s + 0xe) = xref;
          HVar3 = HPDF_Xref_Add(xref,mmgr_local);
          if (HVar3 == 0) {
            HVar3 = HPDF_Dict_AddName((HPDF_Dict)mmgr_local,"Type","Font");
            HVar4 = HPDF_Dict_AddName((HPDF_Dict)mmgr_local,"BaseFont",fontdef->base_font);
            HVar5 = HPDF_Dict_AddName((HPDF_Dict)mmgr_local,"Subtype","Type0");
            lVar6 = HVar5 + HVar4 + HVar3;
            if (fontdef->type == HPDF_FONTDEF_TYPE_CID) {
              HVar3 = HPDF_Dict_AddName((HPDF_Dict)mmgr_local,"Encoding",encoder->name);
              descendant_fonts = (HPDF_Array)(HVar3 + lVar6);
            }
            else {
              HVar2 = HPDF_StrCmp((char *)((long)pvVar1 + 0x4019c),"Identity-H");
              if (HVar2 == 0) {
                HVar3 = HPDF_Dict_AddName((HPDF_Dict)mmgr_local,"Encoding","Identity-H");
                p_Var7 = CreateCMap(encoder,xref);
                *(HPDF_Dict *)(s + 0x14) = p_Var7;
                if (*(long *)(s + 0x14) == 0) {
                  return (HPDF_Font)0x0;
                }
                HVar4 = HPDF_Dict_Add((HPDF_Dict)mmgr_local,"ToUnicode",*(void **)(s + 0x14));
                descendant_fonts = (HPDF_Array)(HVar4 + HVar3 + lVar6);
              }
              else {
                p_Var7 = CreateCMap(encoder,xref);
                *(HPDF_Dict *)(s + 0x14) = p_Var7;
                if (*(long *)(s + 0x14) == 0) {
                  return (HPDF_Font)0x0;
                }
                HVar3 = HPDF_Dict_Add((HPDF_Dict)mmgr_local,"Encoding",*(void **)(s + 0x14));
                descendant_fonts = (HPDF_Array)(HVar3 + lVar6);
              }
            }
            if (descendant_fonts == (HPDF_Array)0x0) {
              array = HPDF_Array_New(mmgr);
              if (array == (HPDF_Array)0x0) {
                mmgr_local = (HPDF_MMgr)0x0;
              }
              else {
                HVar3 = HPDF_Dict_Add((HPDF_Dict)mmgr_local,"DescendantFonts",array);
                if (HVar3 == 0) {
                  if (fontdef->type == HPDF_FONTDEF_TYPE_CID) {
                    p_Var8 = CIDFontType0_New((HPDF_Font)mmgr_local,xref);
                    *(HPDF_Font *)(s + 0x10) = p_Var8;
                    *s = 3;
                  }
                  else {
                    p_Var8 = CIDFontType2_New((HPDF_Font)mmgr_local,xref);
                    *(HPDF_Font *)(s + 0x10) = p_Var8;
                    *s = 4;
                  }
                  if (*(long *)(s + 0x10) == 0) {
                    mmgr_local = (HPDF_MMgr)0x0;
                  }
                  else {
                    HVar3 = HPDF_Array_Add(array,*(void **)(s + 0x10));
                    if (HVar3 != 0) {
                      mmgr_local = (HPDF_MMgr)0x0;
                    }
                  }
                }
                else {
                  mmgr_local = (HPDF_MMgr)0x0;
                }
              }
            }
            else {
              mmgr_local = (HPDF_MMgr)0x0;
            }
          }
          else {
            mmgr_local = (HPDF_MMgr)0x0;
          }
        }
      }
      else {
        HPDF_SetError(((HPDF_Dict)mmgr_local)->error,0x102e,0);
        mmgr_local = (HPDF_MMgr)0x0;
      }
    }
    else {
      HPDF_SetError(((HPDF_Dict)mmgr_local)->error,0x1028,0);
      mmgr_local = (HPDF_MMgr)0x0;
    }
  }
  return (HPDF_Font)mmgr_local;
}

Assistant:

HPDF_Font
HPDF_Type0Font_New  (HPDF_MMgr        mmgr,
                     HPDF_FontDef     fontdef,
                     HPDF_Encoder     encoder,
                     HPDF_Xref        xref)
{
    HPDF_Dict font;
    HPDF_FontAttr attr;
    HPDF_CMapEncoderAttr encoder_attr;
    HPDF_STATUS ret = 0;
    HPDF_Array descendant_fonts;

    HPDF_PTRACE ((" HPDF_Type0Font_New\n"));

    font = HPDF_Dict_New (mmgr);
    if (!font)
        return NULL;

    font->header.obj_class |= HPDF_OSUBCLASS_FONT;

    /* check whether the fontdef object and the encoder object is valid. */
    if (encoder->type != HPDF_ENCODER_TYPE_DOUBLE_BYTE) {
        HPDF_SetError(font->error, HPDF_INVALID_ENCODER_TYPE, 0);
        return NULL;
    }

    if (fontdef->type != HPDF_FONTDEF_TYPE_CID &&
        fontdef->type != HPDF_FONTDEF_TYPE_TRUETYPE) {
        HPDF_SetError(font->error, HPDF_INVALID_FONTDEF_TYPE, 0);
        return NULL;
    }

    attr = HPDF_GetMem (mmgr, sizeof(HPDF_FontAttr_Rec));
    if (!attr) {
        HPDF_Dict_Free (font);
        return NULL;
    }

    font->header.obj_class |= HPDF_OSUBCLASS_FONT;
    font->write_fn = NULL;
    font->free_fn = OnFree_Func;
    font->attr = attr;

    encoder_attr = (HPDF_CMapEncoderAttr)encoder->attr;

    HPDF_MemSet (attr, 0, sizeof(HPDF_FontAttr_Rec));

    attr->writing_mode = encoder_attr->writing_mode;
    attr->text_width_fn = TextWidth;
    attr->measure_text_fn = MeasureText;
    attr->fontdef = fontdef;
    attr->encoder = encoder;
    attr->xref = xref;

    if (HPDF_Xref_Add (xref, font) != HPDF_OK)
        return NULL;

    ret += HPDF_Dict_AddName (font, "Type", "Font");
    ret += HPDF_Dict_AddName (font, "BaseFont", fontdef->base_font);
    ret += HPDF_Dict_AddName (font, "Subtype", "Type0");

    if (fontdef->type == HPDF_FONTDEF_TYPE_CID) {
        ret += HPDF_Dict_AddName (font, "Encoding", encoder->name);
    } else {
        /*
	 * Handle the Unicode encoding, see hpdf_encoding_utf.c For some
	 * reason, xpdf-based readers cannot deal with our cmap but work
	 * fine when using the predefined "Identity-H"
	 * encoding. However, text selection does not work, unless we
	 * add a ToUnicode cmap. This CMap should also be "Identity",
	 * but that does not work -- specifying our cmap as a stream however
	 * does work. Who can understand that ?
	 */
        if (HPDF_StrCmp(encoder_attr->ordering, "Identity-H") == 0) {
	    ret += HPDF_Dict_AddName (font, "Encoding", "Identity-H");
	    attr->cmap_stream = CreateCMap (encoder, xref);

	    if (attr->cmap_stream) {
	        ret += HPDF_Dict_Add (font, "ToUnicode", attr->cmap_stream);
	    } else
	        return NULL;
	} else {
            attr->cmap_stream = CreateCMap (encoder, xref);

	    if (attr->cmap_stream) {
	        ret += HPDF_Dict_Add (font, "Encoding", attr->cmap_stream);
	    } else
	      return NULL;
	}
    }

    if (ret != HPDF_OK)
        return NULL;

    descendant_fonts = HPDF_Array_New (mmgr);
    if (!descendant_fonts)
        return NULL;

    if (HPDF_Dict_Add (font, "DescendantFonts", descendant_fonts) != HPDF_OK)
        return NULL;

    if (fontdef->type == HPDF_FONTDEF_TYPE_CID) {
        attr->descendant_font = CIDFontType0_New (font, xref);
        attr->type = HPDF_FONT_TYPE0_CID;
    } else {
        attr->descendant_font = CIDFontType2_New (font, xref);
        attr->type = HPDF_FONT_TYPE0_TT;
    }

    if (!attr->descendant_font)
        return NULL;
    else
        if (HPDF_Array_Add (descendant_fonts, attr->descendant_font) !=
                HPDF_OK)
            return NULL;

    return font;
}